

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_linux.h
# Opt level: O0

void snmalloc::PALLinux::notify_not_using(void *p,size_t size)

{
  KeepErrno *in_RSI;
  void *in_RDI;
  KeepErrno k;
  
  PALPOSIX<snmalloc::PALLinux,_&writev,_&fsync>::KeepErrno::KeepErrno(in_RSI);
  madvise(in_RDI,(size_t)in_RSI,8);
  PALPOSIX<snmalloc::PALLinux,_&writev,_&fsync>::KeepErrno::~KeepErrno(in_RSI);
  return;
}

Assistant:

static void notify_not_using(void* p, size_t size) noexcept
    {
      KeepErrno k;
      SNMALLOC_ASSERT(is_aligned_block<page_size>(p, size));

      // Fill memory so that when we switch the pages back on we don't make
      // assumptions on the content.
      if constexpr (Debug)
        memset(p, 0x5a, size);

      madvise(p, size, madvise_free_flags);

      if constexpr (mitigations(pal_enforce_access))
      {
        mprotect(p, size, PROT_NONE);
      }
    }